

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

char * bson_iter_symbol(bson_iter_t *iter,uint32_t *length)

{
  size_t *psVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  double dVar5;
  int64_t iVar6;
  _Bool _Var7;
  uint uVar8;
  int iVar9;
  uint8_t *puVar10;
  char *pcVar11;
  size_t sVar12;
  ulong uVar13;
  code *pcVar14;
  bson_oid_t *pbVar15;
  char *__s;
  size_t nbytes;
  ulong uVar16;
  void *mem;
  uint32_t uVar17;
  undefined8 uVar18;
  int32_t iVar19;
  undefined4 *extraout_RDX;
  undefined8 extraout_RDX_00;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var20;
  uint8_t *puVar21;
  anon_union_24_17_78d57918_for_value *dst;
  long lVar22;
  bson_json_reader_cb num_bytes;
  bson_error_t *__s_00;
  bson_t *pbVar23;
  bool bVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_460;
  uint32_t uStack_1a0;
  _Bool _Stack_199;
  bson_t *pbStack_198;
  uint32_t uStack_190;
  uint32_t uStack_18c;
  uint8_t *puStack_188;
  char *apcStack_180 [37];
  
  if (iter != (bson_iter_t *)0x0) {
    puVar21 = iter->raw;
    if (puVar21[iter->type] == '\x0e') {
      puVar10 = puVar21 + iter->d2;
      iVar9 = 1;
      if (1 < *(int *)(puVar21 + iter->d1)) {
        iVar9 = *(int *)(puVar21 + iter->d1);
      }
      uVar17 = iVar9 - 1;
    }
    else {
      puVar10 = (uint8_t *)0x0;
      uVar17 = 0;
    }
    if (length != (uint32_t *)0x0) {
      *length = uVar17;
    }
    return (char *)puVar10;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return (char *)0x0;
    }
    return *(char **)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return (char *)0x0;
    }
    return (char *)(*(ulong *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) /
                   1000);
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar17 = 0;
    pcVar11 = (char *)0x0;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      pcVar11 = *(char **)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar17 = (uint32_t)((ulong)pcVar11 >> 0x20);
    }
    if ((bson_t *)length != (bson_t *)0x0) {
      ((bson_t *)length)->flags = uVar17;
    }
    if (extraout_RDX != (undefined4 *)0x0) {
      *extraout_RDX = (int)pcVar11;
    }
    return pcVar11;
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      ((bson_t *)length)->flags = 0;
      ((bson_t *)length)->len = 0;
      ((bson_t *)length)->padding[0] = '\0';
      ((bson_t *)length)->padding[1] = '\0';
      ((bson_t *)length)->padding[2] = '\0';
      ((bson_t *)length)->padding[3] = '\0';
      ((bson_t *)length)->padding[4] = '\0';
      ((bson_t *)length)->padding[5] = '\0';
      ((bson_t *)length)->padding[6] = '\0';
      ((bson_t *)length)->padding[7] = '\0';
      return (char *)puVar21;
    }
    lVar22 = *(long *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    *(long *)length = lVar22 / 1000;
    pcVar11 = (char *)((lVar22 % 1000) * 1000);
    *(char **)((bson_t *)length)->padding = pcVar11;
    return pcVar11;
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if ((bson_t *)length != (bson_t *)0x0) {
    _Var7 = _bson_iter_next_internal(iter,(char **)&puStack_188,&uStack_190,&_Stack_199);
    if (_Var7) {
      do {
        puVar21 = puStack_188;
        if (*puStack_188 != '\0') {
          sVar12 = strlen((char *)puStack_188);
          _Var7 = bson_utf8_validate((char *)puVar21,sVar12,false);
          if (!_Var7) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)length != (code *)0x0) &&
           (uVar13 = (**(code **)length)(iter,puVar21,extraout_RDX_00), (char)uVar13 != '\0'))
        goto LAB_0011196e;
        switch(uStack_190) {
        case 1:
          pcVar14 = *(code **)(((bson_t *)length)->padding + 0x10);
          if (pcVar14 == (code *)0x0) break;
          dVar5 = bson_iter_double(iter);
          uVar13 = (*pcVar14)(SUB84(dVar5,0),iter,puVar21,extraout_RDX_00);
          goto LAB_001118b2;
        case 2:
          pcVar11 = bson_iter_utf8(iter,(uint32_t *)apcStack_180);
          _Var7 = bson_utf8_validate(pcVar11,(ulong)apcStack_180[0] & 0xffffffff,true);
          if (!_Var7) {
LAB_00111968:
            uVar8 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            uVar13 = (ulong)uVar8;
            *(uint *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) = uVar8;
            goto LAB_0011196e;
          }
          pcVar14 = *(code **)(((bson_t *)length)->padding + 0x18);
          goto LAB_001117d4;
        case 3:
          pbStack_198 = (bson_t *)0x0;
          uStack_1a0 = 0;
          bson_iter_document(iter,&uStack_1a0,(uint8_t **)&pbStack_198);
          _Var7 = bson_init_static((bson_t *)apcStack_180,(uint8_t *)pbStack_198,(ulong)uStack_1a0);
          if (_Var7) {
            pcVar14 = *(code **)(((bson_t *)length)->padding + 0x20);
            goto LAB_0011181e;
          }
          break;
        case 4:
          pbStack_198 = (bson_t *)0x0;
          uStack_1a0 = 0;
          bson_iter_array(iter,&uStack_1a0,(uint8_t **)&pbStack_198);
          _Var7 = bson_init_static((bson_t *)apcStack_180,(uint8_t *)pbStack_198,(ulong)uStack_1a0);
          if (_Var7) {
            pcVar14 = *(code **)(((bson_t *)length)->padding + 0x28);
            goto LAB_0011181e;
          }
          break;
        case 5:
          apcStack_180[0] = (char *)0x0;
          pbStack_198 = (bson_t *)((ulong)pbStack_198 & 0xffffffff00000000);
          uStack_1a0 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_198,&uStack_1a0,(uint8_t **)apcStack_180)
          ;
          if (*(code **)(((bson_t *)length)->padding + 0x30) != (code *)0x0) {
            uVar13 = (**(code **)(((bson_t *)length)->padding + 0x30))
                               (iter,puVar21,(ulong)pbStack_198 & 0xffffffff,uStack_1a0,
                                apcStack_180[0],extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        case 6:
          pcVar14 = *(code **)(((bson_t *)length)->padding + 0x38);
          goto LAB_0011178a;
        case 7:
          pcVar14 = *(code **)(((bson_t *)length)->padding + 0x40);
          if (pcVar14 != (code *)0x0) {
            pbVar15 = bson_iter_oid(iter);
LAB_001118a3:
            uVar13 = (*pcVar14)(iter,puVar21,pbVar15,extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        case 8:
          pcVar14 = *(code **)(((bson_t *)length)->padding + 0x48);
          if (pcVar14 != (code *)0x0) {
            _Var7 = bson_iter_bool(iter);
            uVar8 = (uint)_Var7;
LAB_00111710:
            uVar13 = (*pcVar14)(iter,puVar21,uVar8,extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        case 9:
          pcVar14 = *(code **)(((bson_t *)length)->padding + 0x50);
          if (pcVar14 != (code *)0x0) {
            pbVar15 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_001118a3;
          }
          break;
        case 10:
          pcVar14 = *(code **)(((bson_t *)length)->padding + 0x58);
LAB_0011178a:
          if (pcVar14 == (code *)0x0) break;
LAB_00111799:
          uVar13 = (*pcVar14)(iter,puVar21,extraout_RDX_00);
          goto LAB_001118b2;
        case 0xb:
          apcStack_180[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_180);
          sVar12 = strlen(__s);
          _Var7 = bson_utf8_validate(__s,sVar12,true);
          if (!_Var7) goto LAB_00111968;
          pcVar14 = *(code **)(((bson_t *)length)->padding + 0x60);
          pcVar11 = apcStack_180[0];
          if (pcVar14 == (code *)0x0) break;
          goto LAB_0011188b;
        case 0xc:
          uStack_1a0 = 0;
          apcStack_180[0] = (char *)0x0;
          pbStack_198 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_1a0,apcStack_180,(bson_oid_t **)&pbStack_198);
          _Var7 = bson_utf8_validate(apcStack_180[0],(ulong)uStack_1a0,true);
          if (!_Var7) goto LAB_00111968;
          pcVar14 = *(code **)(((bson_t *)length)->padding + 0x68);
          pcVar11 = apcStack_180[0];
          pbVar23 = pbStack_198;
          if (pcVar14 != (code *)0x0) {
LAB_001115a8:
            uVar13 = (*pcVar14)(iter,puVar21,uStack_1a0,pcVar11,pbVar23,extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        case 0xd:
          pcVar11 = bson_iter_code(iter,(uint32_t *)apcStack_180);
          _Var7 = bson_utf8_validate(pcVar11,(ulong)apcStack_180[0] & 0xffffffff,true);
          if (!_Var7) goto LAB_00111968;
          pcVar14 = *(code **)(((bson_t *)length)->padding + 0x70);
          goto LAB_001117d4;
        case 0xe:
          pcVar11 = bson_iter_symbol(iter,(uint32_t *)apcStack_180);
          _Var7 = bson_utf8_validate(pcVar11,(ulong)apcStack_180[0] & 0xffffffff,true);
          if (!_Var7) goto LAB_00111968;
          pcVar14 = *(code **)((long)length + 0x80);
LAB_001117d4:
          if (pcVar14 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_180[0] & 0xffffffff);
LAB_0011188b:
            uVar13 = (*pcVar14)(iter,puVar21,__s,pcVar11,extraout_RDX_00);
LAB_001118b2:
            if ((char)uVar13 != '\0') goto LAB_0011196e;
          }
          break;
        case 0xf:
          uStack_1a0 = 0;
          pbStack_198 = (bson_t *)0x0;
          uStack_18c = 0;
          pcVar11 = bson_iter_codewscope(iter,&uStack_1a0,&uStack_18c,(uint8_t **)&pbStack_198);
          _Var7 = bson_utf8_validate(pcVar11,(ulong)uStack_1a0,true);
          if (!_Var7) goto LAB_00111968;
          _Var7 = bson_init_static((bson_t *)apcStack_180,(uint8_t *)pbStack_198,(ulong)uStack_18c);
          if ((_Var7) &&
             (pcVar14 = *(code **)((bson_t *)((long)length + 0x80))->padding, pcVar14 != (code *)0x0
             )) {
            pbVar23 = (bson_t *)apcStack_180;
            goto LAB_001115a8;
          }
          break;
        case 0x10:
          pcVar14 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 8);
          if (pcVar14 != (code *)0x0) {
            uVar8 = bson_iter_int32(iter);
            goto LAB_00111710;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_180,(uint32_t *)&pbStack_198);
          if (*(code **)(((bson_t *)((long)length + 0x80))->padding + 0x10) != (code *)0x0) {
            uVar13 = (**(code **)(((bson_t *)((long)length + 0x80))->padding + 0x10))
                               (iter,puVar21,(ulong)apcStack_180[0] & 0xffffffff,
                                (ulong)pbStack_198 & 0xffffffff,extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        case 0x12:
          pcVar14 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x18);
          if (pcVar14 != (code *)0x0) {
            pbVar15 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_001118a3;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_180);
          pcVar14 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x38);
LAB_0011181e:
          if (pcVar14 != (code *)0x0) {
            uVar13 = (*pcVar14)(iter,puVar21,(bson_t *)apcStack_180,extraout_RDX_00);
            goto LAB_001118b2;
          }
          break;
        default:
          if (uStack_190 == 0x7f) {
            pcVar14 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x20);
          }
          else {
            if (uStack_190 != 0xff) break;
            pcVar14 = *(code **)(((bson_t *)((long)length + 0x80))->padding + 0x28);
          }
          if (pcVar14 == (code *)0x0) break;
          puVar21 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_00111799;
        }
        if ((*(code **)((bson_t *)length)->padding != (code *)0x0) &&
           (uVar13 = (**(code **)((bson_t *)length)->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_00), (char)uVar13 != '\0')) {
LAB_0011196e:
          return (char *)CONCAT71((int7)(uVar13 >> 8),1);
        }
        _Var7 = _bson_iter_next_internal(iter,(char **)&puStack_188,&uStack_190,&_Stack_199);
      } while (_Var7);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_199 == true) &&
         (*(long *)(((bson_t *)((long)length + 0x80))->padding + 0x30) != 0)) {
        sVar12 = strlen((char *)puStack_188);
        _Var7 = bson_utf8_validate((char *)puStack_188,sVar12,false);
        if (_Var7) {
          (**(code **)(((bson_t *)((long)length + 0x80))->padding + 0x30))
                    (iter,puStack_188,uStack_190,extraout_RDX_00);
          return (char *)0x0;
        }
      }
      if (*(code **)(((bson_t *)length)->padding + 8) != (code *)0x0) {
        (**(code **)(((bson_t *)length)->padding + 8))(iter,extraout_RDX_00);
      }
    }
    return (char *)0x0;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)length;
    }
    return (char *)puVar21;
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)length;
    }
    return (char *)puVar21;
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(uint32_t **)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = length;
    }
    return (char *)puVar21;
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return (char *)puVar21;
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar8 = *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      lVar22 = *(long *)((bson_t *)length)->padding;
      *(long *)(puVar21 + uVar8) = *(long *)length;
      *(long *)((long)(puVar21 + uVar8) + 8) = lVar22;
    }
    return (char *)puVar21;
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if ((bson_t *)length != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = (bson_t *)length;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_460;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      nbytes = (((bson_json_reader_t *)iter)->producer).bytes_read;
      bVar24 = false;
      while( true ) {
        sVar3 = ((bson_json_reader_t *)iter)->json->pos;
        if (nbytes == 0) {
          nbytes = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)nbytes < 0) {
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
            return (char *)0xffffffff;
          }
          return (char *)0xffffffff;
        }
        if (nbytes == 0) break;
        (((bson_json_reader_t *)iter)->producer).bytes_read = nbytes;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,nbytes);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar21 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar21,puVar21 + ((bson_json_reader_t *)iter)->advance,
                  nbytes - ((bson_json_reader_t *)iter)->advance);
          psVar1 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar1 = *psVar1 - ((bson_json_reader_t *)iter)->advance;
          goto LAB_00111ddb;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) {
          return (char *)0xffffffff;
        }
        uVar13 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar13 != 0xffffffffffffffff) &&
           (uVar4 = ((bson_json_reader_t *)iter)->json->pos, uVar16 = uVar4 - uVar13,
           uVar13 <= uVar4 && uVar16 != 0)) {
          if (uVar16 < nbytes) {
            nbytes = uVar16;
          }
          lVar22 = uVar13 - sVar3;
          if (lVar22 < 1) {
            lVar22 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar22,nbytes);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        bVar24 = true;
        nbytes = 0;
      }
      if (!bVar24) {
        return (char *)0x0;
      }
LAB_00111ddb:
      if ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        return (char *)0xffffffff;
      }
      return (char *)0x1;
    }
    bson_json_reader_read_cold_1();
    p_Var20 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var20 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
      mem = (((bson_json_reader_t *)iter)->producer).data;
    }
    else {
      mem = (((bson_json_reader_t *)iter)->producer).data;
      if ((((bson_json_reader_t *)iter)->producer).cb < p_Var20 + __n + 1) {
        uVar13 = (ulong)(p_Var20 + __n) >> 1 | (ulong)(p_Var20 + __n);
        uVar13 = uVar13 >> 2 | uVar13;
        uVar13 = uVar13 >> 4 | uVar13;
        uVar13 = uVar13 >> 8 | uVar13;
        uVar13 = uVar13 >> 0x10 | uVar13;
        num_bytes = (bson_json_reader_cb)((uVar13 >> 0x20 | uVar13) + 1);
        (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
        mem = bson_realloc(mem,(size_t)num_bytes);
        (((bson_json_reader_t *)iter)->producer).data = mem;
      }
    }
    memcpy((bson_json_destroy_cb)((long)mem + (long)(((bson_json_reader_t *)iter)->producer).dcb),
           length,__n);
    p_Var20 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var20;
    pcVar11 = (char *)(((bson_json_reader_t *)iter)->producer).data;
    pcVar11[(long)p_Var20] = '\0';
    return pcVar11;
  }
  puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar8 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar2 = puVar21[uVar8];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar2
  ;
  switch(bVar2) {
  case 1:
    dVar5 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar5;
    break;
  case 2:
    pcVar11 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar15 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111b7e;
  case 8:
    _Var7 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var7;
    break;
  case 9:
    pcVar11 = (char *)bson_iter_date_time(iter);
    goto LAB_00111c23;
  case 0xb:
    pcVar11 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar15 = (bson_oid_t *)0x0;
    if (puVar21[uVar8] == '\f') {
      uVar8 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar9 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar9 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar21 + uVar8);
      pbVar15 = (bson_oid_t *)(puVar21 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111b7e:
    bson_oid_copy(pbVar15,&dst->v_oid);
    break;
  case 0xd:
    if (puVar21[uVar8] == '\r') {
      iVar9 = 1;
      if (1 < *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar9 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar9 = iVar9 + -1;
      puVar10 = puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      iVar9 = 0;
      puVar10 = (uint8_t *)0x0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
    goto LAB_00111c30;
  case 0xe:
    if (puVar21[uVar8] == '\x0e') {
      puVar10 = puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar9 = 1;
      if (1 < *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar9 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar9 = iVar9 + -1;
    }
    else {
      puVar10 = (uint8_t *)0x0;
      iVar9 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
LAB_00111c30:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar10;
    break;
  case 0xf:
    pcVar11 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0x10:
    iVar19 = 0;
    if (puVar21[uVar8] == '\x10') {
      iVar19 = *(int32_t *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar19;
    break;
  case 0x11:
    iVar19 = 0;
    uVar18 = 0;
    if (puVar21[uVar8] == '\x11') {
      uVar18 = *(undefined8 *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar19 = (int32_t)((ulong)uVar18 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar19;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar18;
    break;
  case 0x12:
    if (puVar21[uVar8] == '\x12') {
      pcVar11 = *(char **)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar11 = (char *)0x0;
    }
LAB_00111c23:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar11;
    break;
  case 0x13:
    if (puVar21[uVar8] == '\x13') {
      iVar6 = *(int64_t *)
               ((long)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar6;
    }
    break;
  default:
    if ((bVar2 != BSON_TYPE_MAXKEY) && (bVar2 != 0xff)) {
      return (char *)0x0;
    }
  }
  return (char *)(bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed;
}

Assistant:

const char *
bson_iter_symbol (const bson_iter_t *iter, /* IN */
                  uint32_t *length)        /* OUT */
{
   const char *ret = NULL;
   uint32_t ret_length = 0;

   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_SYMBOL) {
      ret = (const char *) (iter->raw + iter->d2);
      ret_length = bson_iter_utf8_len_unsafe (iter);
   }

   if (length) {
      *length = ret_length;
   }

   return ret;
}